

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

void __thiscall branch_and_reduce_algorithm::set(branch_and_reduce_algorithm *this,int v,int a)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pvVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  
  piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (piVar3[v] < 0) {
    this->crt = this->crt + a;
    piVar3[v] = a;
    iVar1 = this->rn;
    this->rn = iVar1 + -1;
    (this->vRestore).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[(long)iVar1 + -1] = v;
    if (0x13 < BRANCHING) {
      piVar4 = (this->partition_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar4[v] == 2) {
        this->perform_refinement = true;
      }
      pvVar5 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar6 = *(pointer *)
                ((long)&pvVar5[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (piVar8 = pvVar5[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar8 != piVar6; piVar8 = piVar8 + 1) {
        if ((piVar3[*piVar8] < 0) && (piVar4[*piVar8] == 2)) {
          this->perform_refinement = true;
        }
      }
    }
    if (USE_DEPENDENCY_CHECKING == true) {
      pvVar5 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar8 = pvVar5[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = *(pointer *)
                ((long)&pvVar5[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar8 != piVar6) {
        do {
          ArraySet::Insert(&this->dc_candidates,*piVar8);
          piVar8 = piVar8 + 1;
        } while (piVar8 != piVar6);
      }
      getPackingCandidates(this,v);
    }
    if (a == 0) {
      if (0x13 < BRANCHING) {
        pvVar5 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar8 = pvVar5[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = *(pointer *)
                  ((long)&pvVar5[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        if (piVar8 != piVar6) {
          piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = (this->partition_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            piVar7 = *(pointer *)
                      ((long)&pvVar5[*piVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8);
            for (piVar9 = pvVar5[*piVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start; piVar9 != piVar7; piVar9 = piVar9 + 1) {
              if ((piVar3[*piVar9] < 0) && (piVar4[*piVar9] == 2)) {
                this->perform_refinement = true;
              }
            }
            piVar8 = piVar8 + 1;
          } while (piVar8 != piVar6);
        }
      }
      if (USE_DEPENDENCY_CHECKING == true) {
        pvVar5 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar8 = pvVar5[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = *(pointer *)
                  ((long)&pvVar5[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        if (piVar8 != piVar6) {
          do {
            iVar1 = *piVar8;
            if ((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar1] < 0) {
              pvVar5 = (this->adj).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              piVar7 = *(pointer *)
                        ((long)&pvVar5[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data + 8);
              for (piVar9 = pvVar5[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start; piVar9 != piVar7; piVar9 = piVar9 + 1)
              {
                ArraySet::Insert(&this->dc_candidates,*piVar9);
              }
              getPackingCandidates(this,iVar1);
            }
            piVar8 = piVar8 + 1;
          } while (piVar8 != piVar6);
        }
      }
      pvVar5 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar8 = pvVar5[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = *(pointer *)
                ((long)&pvVar5[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar8 != piVar6) {
        piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->vRestore).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar1 = *piVar8;
          if (piVar3[iVar1] < 0) {
            piVar3[iVar1] = 1;
            this->crt = this->crt + 1;
            iVar2 = this->rn;
            this->rn = iVar2 + -1;
            piVar4[(long)iVar2 + -1] = iVar1;
          }
          piVar8 = piVar8 + 1;
        } while (piVar8 != piVar6);
      }
    }
    return;
  }
  __assert_fail("x[v] < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                ,0x8e,"void branch_and_reduce_algorithm::set(int, int)");
}

Assistant:

void branch_and_reduce_algorithm::set(int v, int a)
{
    assert(x[v] < 0);
    crt += a;
    x[v] = a;
    vRestore[--rn] = v;

    if (BRANCHING >= 20){
        if (partition_index[v] == 2)
            perform_refinement = true;

        for (int n : adj[v]) {
            if (x[n] < 0 && partition_index[n] == 2)
                perform_refinement = true;
        }
    }

    if (USE_DEPENDENCY_CHECKING) {
        for (int n : adj[v]) {
            dc_candidates.Insert(n);
        }

        getPackingCandidates(v);

    }

    if (a == 0)
    {
        if (BRANCHING >= 20){
            for (int u : adj[v]) {
                for (int n : adj[u]) {
                    if (x[n] < 0 && partition_index[n] == 2)
                        perform_refinement = true;
                }
            }
        }

        if(USE_DEPENDENCY_CHECKING) {
            for (int n : adj[v]) {
                if (x[n] < 0) {
                    for (int nn : adj[n]){
                        dc_candidates.Insert(nn);
                    }                    

                    getPackingCandidates(n);
                }
            }
        }

        for (int u : adj[v])
            if (x[u] < 0)
            {
                x[u] = 1;
                crt++;
                vRestore[--rn] = u;
            }
    }
}